

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunc.cpp
# Opt level: O3

ULONG CaseSensitiveComputeHash(char *prgch,char *end)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  undefined4 *puVar4;
  ULONG UVar5;
  
  UVar5 = 0;
  if (prgch < end) {
    UVar5 = 0;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      cVar3 = *prgch;
      if (cVar3 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/HashFunc.cpp"
                           ,0x30,"(utf8::IsStartByte(*prgch) && !utf8::IsLeadByte(*prgch))",
                           "utf8::IsStartByte(*prgch) && !utf8::IsLeadByte(*prgch)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        cVar3 = *prgch;
      }
      prgch = prgch + 1;
      UVar5 = (int)cVar3 + UVar5 * 0x11;
    } while (prgch != end);
  }
  return UVar5;
}

Assistant:

ULONG CaseSensitiveComputeHash(char const * prgch, char const * end)
{
    ULONG luHash = 0;

    while (prgch < end)
    {
        Assert(utf8::IsStartByte(*prgch) && !utf8::IsLeadByte(*prgch));
        luHash = 17 * luHash + *prgch++;
    }
    return luHash;
}